

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O1

void __thiscall hwnet::http::HttpRequest::WriteHeader(HttpRequest *this,function<void_()> *writeOk)

{
  _Any_data *__dest;
  element_type *callback;
  function<void_()> *this_00;
  undefined1 local_98 [32];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_78;
  undefined1 local_68 [8];
  string header;
  
  header._M_dataplus._M_p = (pointer)0x0;
  header._M_string_length._0_1_ = 0;
  local_68 = (undefined1  [8])&header._M_string_length;
  HttpPacket::MakeHeader
            ((this->packet).super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,1,(string *)local_68);
  if ((writeOk->super__Function_base)._M_manager != (_Manager_type)0x0) {
    callback = (((this->session).
                 super___shared_ptr<hwnet::http::HttpSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->s
               ).super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::function<void_()>::function((function<void_()> *)(local_98 + 0x10),writeOk);
    header.field_2._8_8_ = 0;
    this_00 = (function<void_()> *)operator_new(0x20);
    std::function<void_()>::function(this_00,(function<void_()> *)(local_98 + 0x10));
    header.field_2._8_8_ = this_00;
    TCPSocket::SetFlushCallback((TCPSocket *)local_98,(FlushCallback *)callback);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
    }
    __dest = (_Any_data *)((long)&header.field_2 + 8);
    std::
    _Function_handler<void_(const_std::shared_ptr<hwnet::TCPSocket>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sniperHW[P]hwnet/src/net/http/Http.cpp:55:38)>
    ::_M_manager(__dest,__dest,__destroy_functor);
    if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*(code *)local_78._M_pi)(local_98 + 0x10,local_98 + 0x10,3);
    }
  }
  TCPSocket::Send((((this->session).
                    super___shared_ptr<hwnet::http::HttpSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->s).super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                  (string *)local_68);
  if (local_68 != (undefined1  [8])&header._M_string_length) {
    operator_delete((void *)local_68,
                    CONCAT71(header._M_string_length._1_7_,(undefined1)header._M_string_length) + 1)
    ;
  }
  return;
}

Assistant:

void HttpRequest::WriteHeader(const std::function<void ()> &writeOk) {
	std::string header;
	this->packet->MakeHeader(HttpPacket::request,header);
	if(writeOk){
		this->session->s->SetFlushCallback([writeOk](const TCPSocket::Ptr &_){
			(void)_;	
			writeOk();
		});
	}
	this->session->Send(header);
}